

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ed25519-donna-impl-base.h
# Opt level: O3

void ge25519_scalarmult_base_niels
               (ge25519 *r,uint8_t (*basepoint_table) [96],bignum256modm_element_t *s)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  byte *pbVar29;
  byte bVar30;
  byte bVar31;
  char b_00;
  long lVar32;
  uint64_t uVar33;
  uint uVar34;
  byte b_01;
  ulong uVar35;
  long lVar36;
  ulong uVar37;
  ulong uVar38;
  char b [64];
  ge25519_niels t;
  undefined1 local_f8 [16];
  byte local_e8 [64];
  ge25519_niels local_a8;
  
  pbVar29 = local_e8;
  lVar32 = 0;
  do {
    uVar35 = *(ulong *)(*basepoint_table + lVar32 * 8);
    lVar36 = 0xe;
    if (lVar32 == 4) {
      lVar36 = 8;
    }
    do {
      *pbVar29 = (byte)uVar35 & 0xf;
      pbVar29 = pbVar29 + 1;
      uVar35 = uVar35 >> 4;
      lVar36 = lVar36 + -1;
    } while (lVar36 != 0);
    lVar32 = lVar32 + 1;
  } while (lVar32 != 5);
  lVar32 = 1;
  bVar30 = 0;
  b_01 = local_e8[0];
  do {
    bVar30 = b_01 + bVar30;
    b_01 = ((char)bVar30 >> 4) + local_e8[lVar32];
    local_e8[lVar32] = b_01;
    bVar31 = bVar30 & 0xf;
    bVar30 = bVar31 >> 3;
    local_f8[lVar32 + 0xf] = bVar31 + bVar30 * -0x10;
    lVar32 = lVar32 + 1;
  } while (lVar32 != 0x40);
  local_e8[0x3f] = local_e8[0x3f] + bVar30;
  ge25519_scalarmult_base_choose_niels(&local_a8,(uint8_t (*) [96])0x0,(int)(char)local_e8[1],b_01);
  uVar37 = (local_a8.xaddy[0] - local_a8.ysubx[0]) + 0x1fffffffffffb4;
  uVar35 = ((uVar37 >> 0x33) + local_a8.xaddy[1] + 0x1ffffffffffffc) - local_a8.ysubx[1];
  r->x[1] = uVar35 & 0x7ffffffffffff;
  uVar35 = ((local_a8.xaddy[2] + 0x1ffffffffffffc) - local_a8.ysubx[2]) + (uVar35 >> 0x33);
  r->x[2] = uVar35 & 0x7ffffffffffff;
  uVar35 = ((local_a8.xaddy[3] + 0x1ffffffffffffc) - local_a8.ysubx[3]) + (uVar35 >> 0x33);
  r->x[3] = uVar35 & 0x7ffffffffffff;
  uVar35 = ((local_a8.xaddy[4] + 0x1ffffffffffffc) - local_a8.ysubx[4]) + (uVar35 >> 0x33);
  r->x[4] = uVar35 & 0x7ffffffffffff;
  r->x[0] = (uVar35 >> 0x33) * 0x13 + (uVar37 & 0x7ffffffffffff);
  uVar35 = local_a8.xaddy[1] + local_a8.ysubx[1] + (local_a8.ysubx[0] + local_a8.xaddy[0] >> 0x33);
  r->y[1] = uVar35 & 0x7ffffffffffff;
  uVar35 = local_a8.ysubx[2] + local_a8.xaddy[2] + (uVar35 >> 0x33);
  r->y[2] = uVar35 & 0x7ffffffffffff;
  uVar35 = local_a8.ysubx[3] + local_a8.xaddy[3] + (uVar35 >> 0x33);
  r->y[3] = uVar35 & 0x7ffffffffffff;
  uVar35 = local_a8.ysubx[4] + local_a8.xaddy[4] + (uVar35 >> 0x33);
  r->y[4] = uVar35 & 0x7ffffffffffff;
  uVar33 = (uVar35 >> 0x33) * 0x13 + (local_a8.ysubx[0] + local_a8.xaddy[0] & 0x7ffffffffffff);
  r->y[0] = uVar33;
  r->z[1] = 0;
  r->z[2] = 0;
  r->z[3] = 0;
  r->z[4] = 0;
  r->t[0] = local_a8.t2d[0];
  r->t[1] = local_a8.t2d[1];
  r->t[2] = local_a8.t2d[2];
  r->t[3] = local_a8.t2d[3];
  r->t[4] = local_a8.t2d[4];
  r->z[0] = 2;
  uVar35 = 1;
  uVar34 = 1;
  do {
    ge25519_scalarmult_base_choose_niels
              (&local_a8,(uint8_t (*) [96])(ulong)uVar34,(int)(char)local_e8[uVar35 + 2],
               (char)uVar33);
    ge25519_nielsadd2(r,&local_a8);
    b_00 = (char)uVar33;
    uVar35 = uVar35 + 2;
    uVar34 = uVar34 + 1;
  } while (uVar35 < 0x3e);
  ge25519_double_partial(r,r);
  ge25519_double_partial(r,r);
  ge25519_double_partial(r,r);
  ge25519_double(r,r);
  uVar38 = 0;
  ge25519_scalarmult_base_choose_niels(&local_a8,(uint8_t (*) [96])0x0,(int)(char)local_e8[0],b_00);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_a8.t2d[0];
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_a8.t2d[1];
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_a8.t2d[0];
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_a8.t2d[2];
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_a8.t2d[0];
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_a8.t2d[1];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_a8.t2d[3];
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_a8.t2d[0];
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_a8.t2d[2];
  auVar10._8_8_ = 0;
  auVar10._0_8_ = local_a8.t2d[1];
  local_f8._8_8_ = 0;
  local_f8._0_8_ = local_a8.t2d[4];
  local_f8 = local_f8 * ZEXT816(0x34dca135978a3);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = local_a8.t2d[0];
  auVar12._8_8_ = 0;
  auVar12._0_8_ = local_a8.t2d[1];
  auVar13._8_8_ = 0;
  auVar13._0_8_ = local_a8.t2d[3];
  auVar14._8_8_ = 0;
  auVar14._0_8_ = local_a8.t2d[2];
  auVar15._8_8_ = 0;
  auVar15._0_8_ = local_a8.t2d[1];
  auVar16._8_8_ = 0;
  auVar16._0_8_ = local_a8.t2d[4];
  auVar17._8_8_ = 0;
  auVar17._0_8_ = local_a8.t2d[3];
  auVar18._8_8_ = 0;
  auVar18._0_8_ = local_a8.t2d[2];
  auVar1 = auVar16 * ZEXT816(0x1f7afc62973807) +
           auVar18 * ZEXT816(0x8949b964e481e1) +
           auVar1 * ZEXT816(0x34dca135978a3) + auVar15 * ZEXT816(0x6164115ad394ed) +
           auVar17 * ZEXT816(0x70310d2021430b);
  uVar37 = auVar1._0_8_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = local_a8.t2d[2];
  auVar20._8_8_ = 0;
  auVar20._0_8_ = local_a8.t2d[4];
  auVar21._8_8_ = 0;
  auVar21._0_8_ = local_a8.t2d[3];
  auVar22._8_8_ = 0;
  auVar22._0_8_ = local_a8.t2d[3];
  auVar23._8_8_ = 0;
  auVar23._0_8_ = local_a8.t2d[4];
  auVar24._8_8_ = 0;
  auVar24._0_8_ = local_a8.t2d[4];
  auVar28._8_8_ = 0;
  auVar28._0_8_ = auVar1._8_8_ * 0x2000 | uVar37 >> 0x33;
  auVar28 = auVar20 * ZEXT816(0x70310d2021430b) +
            auVar21 * ZEXT816(0x8949b964e481e1) +
            auVar19 * ZEXT816(0x6164115ad394ed) +
            auVar2 * ZEXT816(0x34dca135978a3) + auVar3 * ZEXT816(0x1a8283b156ebd) + auVar28;
  uVar35 = auVar28._0_8_;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = auVar28._8_8_ * 0x2000 | uVar35 >> 0x33;
  uVar35 = uVar35 & 0x7ffffffffffff;
  auVar26 = auVar23 * ZEXT816(0x8949b964e481e1) +
            auVar22 * ZEXT816(0x6164115ad394ed) +
            auVar4 * ZEXT816(0x34dca135978a3) +
            auVar5 * ZEXT816(0x5e7a26001c029) + auVar6 * ZEXT816(0x1a8283b156ebd) + auVar26;
  local_a8.t2d[2] = auVar26._0_8_;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = auVar26._8_8_ * 0x2000 | local_a8.t2d[2] >> 0x33;
  local_a8.t2d[2] = local_a8.t2d[2] & 0x7ffffffffffff;
  auVar25 = auVar24 * ZEXT816(0x6164115ad394ed) +
            auVar9 * ZEXT816(0x1a8283b156ebd) +
            auVar8 * ZEXT816(0x739c663a03cbb) + auVar10 * ZEXT816(0x5e7a26001c029) +
            auVar7 * ZEXT816(0x34dca135978a3) + auVar25;
  local_a8.t2d[3] = auVar25._0_8_;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = auVar25._8_8_ << 0xd | local_a8.t2d[3] >> 0x33;
  local_a8.t2d[3] = local_a8.t2d[3] & 0x7ffffffffffff;
  auVar27 = auVar11 * ZEXT816(0x52036cee2b6ff) + auVar12 * ZEXT816(0x739c663a03cbb) +
            auVar14 * ZEXT816(0x5e7a26001c029) + auVar13 * ZEXT816(0x1a8283b156ebd) + local_f8 +
            auVar27;
  local_a8.t2d[4] = auVar27._0_8_;
  local_a8.t2d[0] =
       (auVar27._8_8_ * 0x2000 | local_a8.t2d[4] >> 0x33) * 0x13 + (uVar37 & 0x7ffffffffffff);
  local_a8.t2d[1] = (local_a8.t2d[0] >> 0x33) + uVar35;
  local_a8.t2d[4] = local_a8.t2d[4] & 0x7ffffffffffff;
  local_a8.t2d[0] = local_a8.t2d[0] & 0x7ffffffffffff;
  ge25519_nielsadd2(r,&local_a8);
  uVar34 = 1;
  do {
    ge25519_scalarmult_base_choose_niels
              (&local_a8,(uint8_t (*) [96])(ulong)uVar34,(int)(char)local_e8[uVar38 + 2],
               (char)uVar35);
    ge25519_nielsadd2(r,&local_a8);
    uVar38 = uVar38 + 2;
    uVar34 = uVar34 + 1;
  } while (uVar38 < 0x3e);
  return;
}

Assistant:

static void
ge25519_scalarmult_base_niels(ge25519 *r, const uint8_t basepoint_table[256][96], const bignum256modm s) {
	signed char b[64];
	uint32_t i;
	ge25519_niels t;

	contract256_window4_modm(b, s);

	ge25519_scalarmult_base_choose_niels(&t, basepoint_table, 0, b[1]);
	curve25519_sub_reduce(r->x, t.xaddy, t.ysubx);
	curve25519_add_reduce(r->y, t.xaddy, t.ysubx);
	memset(r->z, 0, sizeof(bignum25519));
	curve25519_copy(r->t, t.t2d);
	r->z[0] = 2;	
	for (i = 3; i < 64; i += 2) {
		ge25519_scalarmult_base_choose_niels(&t, basepoint_table, i / 2, b[i]);
		ge25519_nielsadd2(r, &t);
	}
	ge25519_double_partial(r, r);
	ge25519_double_partial(r, r);
	ge25519_double_partial(r, r);
	ge25519_double(r, r);
	ge25519_scalarmult_base_choose_niels(&t, basepoint_table, 0, b[0]);
	curve25519_mul(t.t2d, t.t2d, ge25519_ecd);
	ge25519_nielsadd2(r, &t);
	for(i = 2; i < 64; i += 2) {
		ge25519_scalarmult_base_choose_niels(&t, basepoint_table, i / 2, b[i]);
		ge25519_nielsadd2(r, &t);
	}
}